

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.c
# Opt level: O0

void process_arg(ArgumentState *arg_state,int i,char ***argv)

{
  char cVar1;
  ArgumentDescription *pAVar2;
  char *pcVar3;
  char **ppcVar4;
  int iVar5;
  long lVar6;
  size_t sVar7;
  double dVar8;
  ArgumentDescription *local_40;
  char type;
  ArgumentDescription *desc;
  char *arg;
  char ***argv_local;
  int i_local;
  ArgumentState *arg_state_local;
  
  desc = (ArgumentDescription *)0x0;
  pAVar2 = arg_state->desc;
  if (pAVar2[i].type != (char *)0x0) {
    cVar1 = *pAVar2[i].type;
    if ((cVar1 == 'F') || (cVar1 == 'f')) {
      *(uint *)pAVar2[i].location = (uint)(cVar1 == 'F');
    }
    else if (cVar1 == 'T') {
      *(uint *)pAVar2[i].location = (uint)((*pAVar2[i].location != 0 ^ 0xffU) & 1);
    }
    else if (cVar1 == '+') {
      *(int *)pAVar2[i].location = *pAVar2[i].location + 1;
    }
    else {
      pcVar3 = **argv;
      **argv = pcVar3 + 1;
      if (pcVar3[1] == '\0') {
        ppcVar4 = *argv;
        *argv = ppcVar4 + 1;
        local_40 = (ArgumentDescription *)ppcVar4[1];
      }
      else {
        local_40 = (ArgumentDescription *)**argv;
      }
      desc = local_40;
      if (local_40 == (ArgumentDescription *)0x0) {
        usage(arg_state,(char *)0x0);
      }
      switch(cVar1) {
      case 'D':
        dVar8 = atof((char *)local_40);
        *(double *)pAVar2[i].location = dVar8;
        break;
      default:
        fprintf(_stderr,"%s:bad argument description\n",arg_state->program_name);
        exit(1);
      case 'I':
        iVar5 = atoi((char *)local_40);
        *(int *)pAVar2[i].location = iVar5;
        break;
      case 'L':
        lVar6 = atol((char *)local_40);
        *(long *)pAVar2[i].location = lVar6;
        break;
      case 'S':
        pcVar3 = (char *)pAVar2[i].location;
        iVar5 = atoi(pAVar2[i].type + 1);
        strncpy(pcVar3,(char *)local_40,(long)iVar5);
      }
      sVar7 = strlen(**argv);
      **argv = **argv + (sVar7 - 1);
    }
  }
  if (pAVar2[i].pfn != (ArgumentFunction *)0x0) {
    (*pAVar2[i].pfn)(arg_state,(char *)desc);
  }
  return;
}

Assistant:

void process_arg(ArgumentState *arg_state, int i, char ***argv) {
  char *arg = NULL;
  ArgumentDescription *desc = arg_state->desc;
  if (desc[i].type) {
    char type = desc[i].type[0];
    if (type == 'F' || type == 'f')
      *(int *)desc[i].location = type == 'F' ? 1 : 0;
    else if (type == 'T')
      *(int *)desc[i].location = !*(int *)desc[i].location;
    else if (type == '+')
      (*(int *)desc[i].location)++;
    else {
      arg = *++(**argv) ? **argv : *++(*argv);
      if (!arg) usage(arg_state, NULL);
      switch (type) {
        case 'I':
          *(int *)desc[i].location = atoi(arg);
          break;
        case 'D':
          *(double *)desc[i].location = atof(arg);
          break;
        case 'L':
          *(int64 *)desc[i].location = atoll(arg);
          break;
        case 'S':
          strncpy((char *)desc[i].location, arg, atoi(desc[i].type + 1));
          break;
        default:
          fprintf(stderr, "%s:bad argument description\n", arg_state->program_name);
          exit(1);
          break;
      }
      **argv += strlen(**argv) - 1;
    }
  }
  if (desc[i].pfn) desc[i].pfn(arg_state, arg);
}